

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

bool __thiscall nivalis::Expr::ASTNode::operator==(ASTNode *this,ASTNode *other)

{
  uint uVar1;
  
  uVar1 = this->opcode;
  if ((other->opcode == uVar1) &&
     (((0x12 < uVar1 || ((0x6020eU >> (uVar1 & 0x1f) & 1) == 0)) ||
      ((this->field_1).ref == (other->field_1).ref)))) {
    return true;
  }
  return false;
}

Assistant:

bool Expr::ASTNode::operator==(const ASTNode& other) const {
    if (other.opcode != opcode) return false;
    if ((OpCode::has_ref(opcode) || opcode == OpCode::val ||
            opcode == OpCode::thunk_jmp) &&
        ref != other.ref) return false;
    return true;
}